

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActivationFactory.cpp
# Opt level: O2

activationType PyreNet::ActivationFactory::fromString(string *activation)

{
  bool bVar1;
  activationType aVar2;
  undefined8 *puVar3;
  
  bVar1 = std::operator==(activation,"step");
  aVar2 = step;
  if (!bVar1) {
    bVar1 = std::operator==(activation,"linear");
    if (bVar1) {
      aVar2 = linear;
    }
    else {
      bVar1 = std::operator==(activation,"tanh");
      if (bVar1) {
        aVar2 = tanh;
      }
      else {
        bVar1 = std::operator==(activation,"sigmoid");
        if (bVar1) {
          aVar2 = sigmoid;
        }
        else {
          bVar1 = std::operator==(activation,"relu");
          if (!bVar1) {
            puVar3 = (undefined8 *)__cxa_allocate_exception(8);
            *puVar3 = std::operator>>;
            __cxa_throw(puVar3,&std::exception::typeinfo,std::exception::~exception);
          }
          aVar2 = relu;
        }
      }
    }
  }
  return aVar2;
}

Assistant:

LayerDefinition::activationType ActivationFactory::fromString(const std::string& activation) {
        if (activation == "step") {
            return LayerDefinition::step;
        } else if (activation == "linear") {
            return LayerDefinition::linear;
        } else if (activation == "tanh") {
            return LayerDefinition::tanh;
        } else if (activation == "sigmoid") {
            return LayerDefinition::sigmoid;
        } else if (activation == "relu") {
            return LayerDefinition::relu;
        } else {
            throw std::exception();
        }
    }